

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void ZSTDMT_waitForLdmComplete(ZSTDMT_CCtx *mtctx,buffer_t buffer)

{
  pthread_mutex_t *__mutex;
  uint uVar1;
  uint uVar2;
  BYTE *pBVar3;
  BYTE *pBVar4;
  size_t sVar5;
  BYTE *bufferEnd;
  BYTE *pBVar6;
  BYTE *pBVar7;
  BYTE *bufferStart;
  
  sVar5 = buffer.capacity;
  pBVar6 = (BYTE *)buffer.start;
  if ((mtctx->params).ldmParams.enableLdm != 0) {
    __mutex = &(mtctx->serial).ldmWindowMutex;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    while( true ) {
      pBVar3 = (mtctx->serial).ldmWindow.nextSrc;
      pBVar4 = (mtctx->serial).ldmWindow.base;
      pBVar7 = (mtctx->serial).ldmWindow.dictBase;
      uVar1 = (mtctx->serial).ldmWindow.dictLimit;
      uVar2 = (mtctx->serial).ldmWindow.lowLimit;
      if (((((pBVar6 == (BYTE *)0x0 || sVar5 == 0) || pBVar7 == (BYTE *)0x0) || uVar1 == uVar2) ||
          (pBVar7 = pBVar7 + uVar2, pBVar6 + sVar5 <= pBVar7 || pBVar7 + (uVar1 - uVar2) <= pBVar6))
         && (((pBVar4 == (BYTE *)0x0 ||
              (((pBVar6 == (BYTE *)0x0 || (sVar5 == 0)) ||
               (pBVar4 = pBVar4 + uVar1, pBVar3 == pBVar4)))) ||
             ((pBVar3 <= pBVar6 || (pBVar6 + sVar5 <= pBVar4)))))) break;
      pthread_cond_wait((pthread_cond_t *)&(mtctx->serial).ldmWindowCond,(pthread_mutex_t *)__mutex)
      ;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  return;
}

Assistant:

static void ZSTDMT_waitForLdmComplete(ZSTDMT_CCtx* mtctx, buffer_t buffer)
{
    if (mtctx->params.ldmParams.enableLdm) {
        ZSTD_pthread_mutex_t* mutex = &mtctx->serial.ldmWindowMutex;
        DEBUGLOG(5, "ZSTDMT_waitForLdmComplete");
        DEBUGLOG(5, "source  [0x%zx, 0x%zx)",
                    (size_t)buffer.start,
                    (size_t)buffer.start + buffer.capacity);
        ZSTD_PTHREAD_MUTEX_LOCK(mutex);
        while (ZSTDMT_doesOverlapWindow(buffer, mtctx->serial.ldmWindow)) {
            DEBUGLOG(5, "Waiting for LDM to finish...");
            ZSTD_pthread_cond_wait(&mtctx->serial.ldmWindowCond, mutex);
        }
        DEBUGLOG(6, "Done waiting for LDM to finish");
        ZSTD_pthread_mutex_unlock(mutex);
    }
}